

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  SrcList *pSVar1;
  RenameCtx *pCtx;
  int iVar2;
  long lVar3;
  Table **ppTVar4;
  
  if ((pSelect->selFlags & 0x4200000) != 0) {
    return 1;
  }
  pSVar1 = pSelect->pSrc;
  if (pSVar1 == (SrcList *)0x0) {
    iVar2 = 2;
  }
  else {
    if (0 < pSVar1->nSrc) {
      pCtx = (pWalker->u).pRename;
      ppTVar4 = &pSVar1->a[0].pTab;
      lVar3 = 0;
      do {
        if (*ppTVar4 == pCtx->pTab) {
          renameTokenFind(pWalker->pParse,pCtx,ppTVar4[-2]);
        }
        lVar3 = lVar3 + 1;
        ppTVar4 = ppTVar4 + 0xd;
      } while (lVar3 < pSVar1->nSrc);
    }
    renameWalkWith(pWalker,pSelect);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  if( pSelect->selFlags & (SF_View|SF_CopyCte) ){
    testcase( pSelect->selFlags & SF_View );
    testcase( pSelect->selFlags & SF_CopyCte );
    return WRC_Prune;
  }
  if( NEVER(pSrc==0) ){
    assert( pWalker->pParse->db->mallocFailed );
    return WRC_Abort;
  }
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *pItem = &pSrc->a[i];
    if( pItem->pTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }
  renameWalkWith(pWalker, pSelect);

  return WRC_Continue;
}